

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_sraiq(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGv_i64 ret;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGLabel *l;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGLabel *l1;
  int sh;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  s = ctx->uc->tcg_ctx;
  uVar1 = SH(ctx->opcode);
  l = gen_new_label_ppc64(s);
  ret_00 = tcg_temp_new_i64(s);
  ret_01 = tcg_temp_new_i64(s);
  uVar2 = rS(ctx->opcode);
  tcg_gen_shri_i64_ppc64(s,ret_00,cpu_gpr[uVar2],(long)(int)uVar1);
  uVar2 = rS(ctx->opcode);
  tcg_gen_shli_i64_ppc64(s,ret_01,cpu_gpr[uVar2],(long)(int)(0x20 - uVar1));
  tcg_gen_or_i64_ppc64(s,ret_00,ret_00,ret_01);
  gen_store_spr(s,0,ret_00);
  tcg_gen_movi_i64_ppc64(s,cpu_ca,0);
  tcg_gen_brcondi_i64_ppc64(s,TCG_COND_EQ,ret_01,0,l);
  uVar2 = rS(ctx->opcode);
  tcg_gen_brcondi_i64_ppc64(s,TCG_COND_GE,cpu_gpr[uVar2],0,l);
  tcg_gen_movi_i64_ppc64(s,cpu_ca,1);
  gen_set_label(s,l);
  uVar2 = rA(ctx->opcode);
  ret = cpu_gpr[uVar2];
  uVar2 = rS(ctx->opcode);
  tcg_gen_sari_i64_ppc64(s,ret,cpu_gpr[uVar2],(long)(int)uVar1);
  tcg_temp_free_i64(s,ret_00);
  tcg_temp_free_i64(s,ret_01);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rA(ctx->opcode);
    gen_set_Rc0(ctx,cpu_gpr[uVar1]);
  }
  return;
}

Assistant:

static void gen_sraiq(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int sh = SH(ctx->opcode);
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    tcg_gen_shri_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)], sh);
    tcg_gen_shli_tl(tcg_ctx, t1, cpu_gpr[rS(ctx->opcode)], 32 - sh);
    tcg_gen_or_tl(tcg_ctx, t0, t0, t1);
    gen_store_spr(tcg_ctx, SPR_MQ, t0);
    tcg_gen_movi_tl(tcg_ctx, cpu_ca, 0);
    tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t1, 0, l1);
    tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, cpu_gpr[rS(ctx->opcode)], 0, l1);
    tcg_gen_movi_tl(tcg_ctx, cpu_ca, 1);
    gen_set_label(tcg_ctx, l1);
    tcg_gen_sari_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rS(ctx->opcode)], sh);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}